

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall
Test_Template_WeirdSyntax::Test_Template_WeirdSyntax(Test_Template_WeirdSyntax *this)

{
  value_type local_18;
  Test_Template_WeirdSyntax *local_10;
  Test_Template_WeirdSyntax *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(Template, WeirdSyntax) {
  TemplateDictionary dict("dict");

  // When we see {{{, we should match the second {{, not the first.
  Template* tpl1 = StringToTemplate("hi {{{! VAR {{!VAR} }} lo",
                                    STRIP_WHITESPACE);
  AssertExpandIs(tpl1, &dict, "hi { lo", true);

  // Likewise for }}}
  Template* tpl2 = StringToTemplate("fn(){{{BI_NEWLINE}} x=4;{{BI_NEWLINE}}}",
                                    DO_NOT_STRIP);
  AssertExpandIs(tpl2, &dict, "fn(){\n x=4;\n}", true);

  // Try lots of {'s!
  Template* tpl3 = StringToTemplate("{{{{{{VAR}}}}}}}}", DO_NOT_STRIP);
  AssertExpandIs(tpl3, &dict, "{{{{}}}}}}", true);
}